

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::JavascriptStackWalker::UpdateFrame(JavascriptStackWalker *this,bool includeInlineFrames)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  JavascriptFunction *pJVar4;
  JavascriptFunction *pJVar5;
  ScriptFunction *pSVar6;
  JavascriptStackWalker *pJVar7;
  undefined4 *puVar8;
  ScriptContext *pSVar9;
  uint local_30;
  bool inlinedFramesFound;
  bool hasInlinedFramesOnStack;
  int loopNum;
  bool isCurrentPhysicalFrameForLoopBody;
  JavascriptFunction *function;
  bool includeInlineFrames_local;
  JavascriptStackWalker *this_local;
  
  bVar2 = CheckJavascriptFrame(this,includeInlineFrames);
  *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffb | (ushort)bVar2 << 2;
  bVar2 = IsJavascriptFrame(this);
  if (bVar2) {
    this_local = (JavascriptStackWalker *)GetCurrentFunction(this,true);
    bVar2 = IsCurrentPhysicalFrameForLoopBody(this);
    if (this->interpreterFrame == (InterpreterStackFrame *)0x0) {
      if ((*(ushort *)&this->field_0x50 >> 3 & 1) == 0) {
        bVar3 = HasInlinedFramesOnStack(this);
        if ((bVar3) && ((!includeInlineFrames || (!bVar2)))) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                      ,0x25c,
                                      "(!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody))"
                                      ,
                                      "!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody)"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        bVar2 = HasInlinedFramesOnStack(this);
        if ((!bVar2) && (includeInlineFrames)) {
          if ((this->lastInternalFrameInfo).codeAddress != (void *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                        ,0x262,"(lastInternalFrameInfo.codeAddress == nullptr)",
                                        "lastInternalFrameInfo.codeAddress == nullptr");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          pSVar6 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>
                             ((JavascriptFunction *)this_local);
          bVar2 = InlinedFrameWalker::FromPhysicalFrame
                            (&this->inlinedFrameWalker,&this->currentFrame,pSVar6,false,-1,
                             (JavascriptStackWalker *)0x0,false,false);
          if (bVar2) {
            bVar2 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
            *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffe | (ushort)bVar2;
            *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffd | 2;
            if ((*(ushort *)&this->field_0x50 & 1) == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                          ,0x271,"(inlinedFramesBeingWalked)",
                                          "inlinedFramesBeingWalked");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
          }
        }
      }
    }
    else {
      if ((this->lastInternalFrameInfo).codeAddress != (void *)0x0) {
        *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xff7f | 0x80;
      }
      bVar3 = InterpreterStackFrame::TestFlags(this->interpreterFrame,8);
      if (bVar3) {
        *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xffbf | 0x40;
        if ((*(ushort *)&this->field_0x50 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                      ,0x229,"(!inlinedFramesBeingWalked)",
                                      "!inlinedFramesBeingWalked");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (includeInlineFrames) {
          local_30 = 0xffffffff;
          if (bVar2) {
            local_30 = InterpreterStackFrame::GetCurrentLoopNum(this->tempInterpreterFrame);
          }
          pSVar6 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>
                             ((JavascriptFunction *)this_local);
          bVar3 = InlinedFrameWalker::FromPhysicalFrame
                            (&this->inlinedFrameWalker,&this->currentFrame,pSVar6,true,local_30,this
                             ,false,false);
          if (bVar3) {
            bVar2 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
            *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffe | (ushort)bVar2;
            *(ushort *)&this->field_0x50 =
                 *(ushort *)&this->field_0x50 & 0xfffd | (ushort)bVar3 << 1;
            if ((*(ushort *)&this->field_0x50 & 1) == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                          ,0x23d,"(inlinedFramesBeingWalked)",
                                          "inlinedFramesBeingWalked");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            pSVar6 = InterpreterStackFrame::GetJavascriptFunction(this->interpreterFrame);
            pJVar4 = StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)pSVar6);
            pJVar5 = InlinedFrameWalker::GetFunctionObject(&this->inlinedFrameWalker);
            if (pJVar4 != pJVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                          ,0x23e,
                                          "(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject())"
                                          ,
                                          "StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject()"
                                         );
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
          }
          else if (bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                        ,0x242,"(!isCurrentPhysicalFrameForLoopBody)",
                                        "!isCurrentPhysicalFrameForLoopBody");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
        }
        else if (bVar2) {
          SetCachedInternalFrameInfo
                    (this,InternalFrameType_LoopBody,(JavascriptFunction *)this_local,false,true);
        }
      }
      else {
        pSVar6 = InterpreterStackFrame::GetJavascriptFunction(this->interpreterFrame);
        pJVar7 = (JavascriptStackWalker *)
                 StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)pSVar6);
        if (pJVar7 != this_local) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                      ,0x255,
                                      "(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function)"
                                      ,
                                      "StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xffbf;
      }
    }
    pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)this_local);
    this->scriptContext = pSVar9;
  }
  else {
    this_local = (JavascriptStackWalker *)0x0;
  }
  return (JavascriptFunction *)this_local;
}

Assistant:

Js::JavascriptFunction * JavascriptStackWalker::UpdateFrame(bool includeInlineFrames)
    {
        this->isJavascriptFrame = this->CheckJavascriptFrame(includeInlineFrames);

        if (this->IsJavascriptFrame())
        {
            // In case we have a cross site thunk, update the script context
            Js::JavascriptFunction *function = this->GetCurrentFunction();

#if ENABLE_NATIVE_CODEGEN
            bool isCurrentPhysicalFrameForLoopBody = this->IsCurrentPhysicalFrameForLoopBody();
#endif
            if (this->interpreterFrame)
            {
#if ENABLE_NATIVE_CODEGEN
                if (lastInternalFrameInfo.codeAddress != nullptr)
                {
                    this->previousInterpreterFrameIsForLoopBody = true;
                }
#endif

                // We might've bailed out of an inlinee, so check if there were any inlinees.
                if (this->interpreterFrame->TestFlags(InterpreterStackFrameFlags_FromBailOut))
                {
                    previousInterpreterFrameIsFromBailout = true;

#if ENABLE_NATIVE_CODEGEN
                    Assert(!inlinedFramesBeingWalked);
                    if (includeInlineFrames)
                    {
                        int loopNum = -1;
                        if (isCurrentPhysicalFrameForLoopBody)
                        {
                            loopNum = this->tempInterpreterFrame->GetCurrentLoopNum();
                        }

                        bool hasInlinedFramesOnStack = InlinedFrameWalker::FromPhysicalFrame(inlinedFrameWalker, currentFrame,
                            VarTo<ScriptFunction>(function), true /*fromBailout*/, loopNum, this, false /*useInternalFrameInfo*/, false /*noAlloc*/);

                        if (hasInlinedFramesOnStack)
                        {
                            // We're now back in the state where currentFrame == physical frame of the inliner, but
                            // since interpreterFrame != null, we'll pick values from the interpreterFrame (the bailout
                            // frame of the inliner). Set a flag to tell the stack walker that it needs to start from the
                            // inlinee frames on the stack when Walk() is called.
                            this->inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
                            this->hasInlinedFramesOnStack = hasInlinedFramesOnStack;
                            Assert(inlinedFramesBeingWalked);
                            Assert(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject());
                        }
                        else
                        {
                            Assert(!isCurrentPhysicalFrameForLoopBody);
                        }
                    }
                    else if (isCurrentPhysicalFrameForLoopBody)
                    {
                        // Getting here is only possible when the current interpreterFrame is for a function which
                        // encountered a bailout after getting inlined in a jitted loop body. If we are not including
                        // inlined frames in the stack walk, we need to set the codeAddress on lastInternalFrameInfo,
                        // which would have otherwise been set upon closing the inlinedFrameWalker, now.
                        // Note that we already have an assert in CheckJavascriptFrame to ensure this.
                        SetCachedInternalFrameInfo(InternalFrameType_LoopBody, function, false /*hasInlinedFramesOnStack*/, true /*previousInterpreterFrameIsFromBailout*/);
                    }
#else
                    // How did we bail out when JIT was disabled?
                    Assert(false);
#endif
                }
                else
                {
                    Assert(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function);
                    previousInterpreterFrameIsFromBailout = false;
                }
            }
            else if (!this->isNativeLibraryFrame)
            {
#if ENABLE_NATIVE_CODEGEN
                Assert(!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody));

                if (!HasInlinedFramesOnStack() && includeInlineFrames)
                {
                    // Check whether there are inlined frames nested in this native frame. The corresponding check for
                    // a jitted loop body frame should have been done in CheckJavascriptFrame
                    Assert(lastInternalFrameInfo.codeAddress == nullptr);
                    bool inlinedFramesFound = InlinedFrameWalker::FromPhysicalFrame(
                        inlinedFrameWalker,
                        currentFrame,
                        VarTo<ScriptFunction>(function),
                        false,  // fromBailout
                        -1,     // loopNum
                        nullptr,// walker
                        false,  // useInternalFrameInfo
                        false   // noAlloc
                    );
                    if (inlinedFramesFound)
                    {
                        this->inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
                        this->hasInlinedFramesOnStack = true;
                        Assert(inlinedFramesBeingWalked);
                    }
                }
#endif
            }
            this->scriptContext = function->GetScriptContext();
            return function;
        }
        return nullptr;
    }